

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::LegacyScriptPubKeyMan::TopUpInactiveHDChain
          (LegacyScriptPubKeyMan *this,CKeyID seed_id,int64_t index,bool internal)

{
  long lVar1;
  int iVar2;
  iterator iVar3;
  undefined4 extraout_var;
  pointer *__ptr;
  long lVar5;
  long in_FS_OFFSET;
  WalletBatch local_48;
  unique_lock<std::recursive_mutex> local_38;
  long local_28;
  WalletDatabase *pWVar4;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_38._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_38);
  iVar3 = std::
          _Hashtable<CKeyID,_std::pair<const_CKeyID,_wallet::CHDChain>,_std::allocator<std::pair<const_CKeyID,_wallet::CHDChain>_>,_std::__detail::_Select1st,_std::equal_to<CKeyID>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->super_LegacyDataSPKM).m_inactive_hd_chains._M_h,&seed_id);
  if (iVar3.super__Node_iterator_base<std::pair<const_CKeyID,_wallet::CHDChain>,_true>._M_cur !=
      (__node_type *)0x0) {
    lVar1 = *(long *)((long)iVar3.
                            super__Node_iterator_base<std::pair<const_CKeyID,_wallet::CHDChain>,_true>
                            ._M_cur + 0x40 + (ulong)internal * 8);
    lVar5 = index + 1;
    if (index + 1 < lVar1) {
      lVar5 = lVar1;
    }
    *(long *)((long)iVar3.super__Node_iterator_base<std::pair<const_CKeyID,_wallet::CHDChain>,_true>
                    ._M_cur + 0x40 + (ulong)internal * 8) = lVar5;
    iVar2 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3]
            )();
    pWVar4 = (WalletDatabase *)CONCAT44(extraout_var,iVar2);
    (*pWVar4->_vptr_WalletDatabase[0xe])(&local_48,pWVar4,1);
    local_48.m_database = pWVar4;
    TopUpChain(this,&local_48,
               (CHDChain *)
               ((long)iVar3.
                      super__Node_iterator_base<std::pair<const_CKeyID,_wallet::CHDChain>,_true>.
                      _M_cur + 0x20),0);
    if (local_48.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
      (*(*(_func_int ***)
          local_48.m_batch._M_t.
          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
          _M_t.
          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar3.super__Node_iterator_base<std::pair<const_CKeyID,_wallet::CHDChain>,_true>._M_cur
           != (__node_type *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::TopUpInactiveHDChain(const CKeyID seed_id, int64_t index, bool internal)
{
    LOCK(cs_KeyStore);

    auto it = m_inactive_hd_chains.find(seed_id);
    if (it == m_inactive_hd_chains.end()) {
        return false;
    }

    CHDChain& chain = it->second;

    if (internal) {
        chain.m_next_internal_index = std::max(chain.m_next_internal_index, index + 1);
    } else {
        chain.m_next_external_index = std::max(chain.m_next_external_index, index + 1);
    }

    WalletBatch batch(m_storage.GetDatabase());
    TopUpChain(batch, chain, 0);

    return true;
}